

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::loadSkeleton(Application *this,char *filename,Scene *scene)

{
  Skeleton *this_00;
  undefined8 *puVar1;
  long lVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  undefined8 *puVar6;
  int iVar7;
  string filenameNoExt;
  set<double,_std::less<double>,_std::allocator<double>_> knotTimes;
  stringstream loadfilename;
  string local_228 [32];
  char *local_208 [4];
  _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
  local_1e8;
  allocator local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::string::string(local_228,filename,local_1b8);
  iVar7 = 0;
  std::__cxx11::string::find((char *)local_228,0x1f04f1);
  std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_228);
  std::__cxx11::string::operator=(local_228,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  for (p_Var5 = (scene->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(scene->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if ((*(long *)(p_Var5 + 1) != 0) &&
       (lVar2 = __dynamic_cast(*(long *)(p_Var5 + 1),&DynamicScene::SceneObject::typeinfo,
                               &DynamicScene::Mesh::typeinfo,0), lVar2 != 0)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      poVar3 = std::operator<<(local_1a8,local_228);
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar7);
      std::operator<<(poVar3,"_skel.xml");
      this_00 = *(Skeleton **)(lVar2 + 0x168);
      std::__cxx11::stringbuf::str();
      DynamicScene::Skeleton::load
                ((set<double,_std::less<double>,_std::allocator<double>_> *)&local_1e8,this_00,
                 local_208[0]);
      std::__cxx11::string::~string((string *)local_208);
      puVar1 = *(undefined8 **)(*(long *)(lVar2 + 0x168) + 0x108);
      for (puVar6 = *(undefined8 **)(*(long *)(lVar2 + 0x168) + 0x100); puVar6 != puVar1;
          puVar6 = puVar6 + 1) {
        DynamicScene::Scene::addObject(scene,(SceneObject *)*puVar6);
      }
      for (p_Var4 = local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &local_1e8._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        Timeline::markTime(&this->timeline,(int)*(double *)(p_Var4 + 1));
      }
      iVar7 = iVar7 + 1;
      std::
      _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
      ~_Rb_tree(&local_1e8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    }
  }
  std::__cxx11::string::~string(local_228);
  return;
}

Assistant:

void CMU462::Application::loadSkeleton(const char *filename,
                                       DynamicScene::Scene *scene) {
  string filenameNoExt(filename);
  filenameNoExt = filenameNoExt.substr(0, filenameNoExt.find("."));
  int meshID = 0;
  for (auto object : scene->objects) {
    DynamicScene::Mesh *mesh = dynamic_cast<DynamicScene::Mesh *>(object);
    if (mesh) {
      stringstream loadfilename;
      loadfilename << filenameNoExt << "_" << meshID << "_skel.xml";
      set<double> knotTimes = mesh->skeleton->load(loadfilename.str().c_str());
      // Add all joints to the scene
      for (auto joint : mesh->skeleton->joints) {
        scene->addObject(joint);
      }
      // Mark all knots on the timeline
      for (auto knotTime : knotTimes) {
        timeline.markTime(knotTime);
      }
      meshID++;
    }
  }
}